

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

json_node_t * __thiscall shine::json_node_t::find_kv_child(json_node_t *this,string *key)

{
  bool bVar1;
  uint8 *puVar2;
  __shared_ptr *this_00;
  __shared_ptr_access<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var3;
  element_type *peVar4;
  pointer ppVar5;
  _Self local_30;
  _Self local_28;
  iterator iter;
  string *key_local;
  json_node_t *this_local;
  
  iter._M_node = (_Base_ptr)key;
  puVar2 = get_type(this);
  if (*puVar2 == '\x05') {
    this_00 = (__shared_ptr *)get_kv_childs(this);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
    if (bVar1) {
      p_Var3 = (__shared_ptr_access<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)get_kv_childs(this);
      peVar4 = std::
               __shared_ptr_access<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      local_28._M_node =
           (_Base_ptr)
           std::
           map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>
           ::find(peVar4,iter._M_node);
      p_Var3 = (__shared_ptr_access<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)get_kv_childs(this);
      peVar4 = std::
               __shared_ptr_access<std::map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(p_Var3);
      local_30._M_node =
           (_Base_ptr)
           std::
           map<shine::string,_shine::json_node_t,_std::less<shine::string>,_std::allocator<std::pair<const_shine::string,_shine::json_node_t>_>_>
           ::end(peVar4);
      bVar1 = std::operator!=(&local_28,&local_30);
      if (bVar1) {
        ppVar5 = std::_Rb_tree_iterator<std::pair<const_shine::string,_shine::json_node_t>_>::
                 operator->(&local_28);
        return &ppVar5->second;
      }
    }
  }
  return (json_node_t *)0x0;
}

Assistant:

json_node_t *find_kv_child(const string &key) {
            if (get_type() != e_object)
                return nullptr;

            if (get_kv_childs())
            {
                auto iter = get_kv_childs()->find(key);
                if (iter != get_kv_childs()->end())
                    return &iter->second;
            }

            return nullptr;
        }